

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

int32 dict_word2basestr(char *word)

{
  uint uVar1;
  size_t sVar2;
  
  sVar2 = strlen(word);
  if (word[(int)sVar2 + -1] == ')') {
    for (uVar1 = (int)sVar2 - 2; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
      if (word[uVar1] == '(') {
        word[uVar1] = '\0';
        return uVar1;
      }
    }
  }
  return -1;
}

Assistant:

int32
dict_word2basestr(char *word)
{
    int32 i, len;

    len = strlen(word);
    if (word[len - 1] == ')') {
        for (i = len - 2; (i > 0) && (word[i] != '('); --i);

        if (i > 0) {
            /* The word is of the form <baseword>(...); strip from left-paren */
            word[i] = '\0';
            return i;
        }
    }

    return -1;
}